

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O3

string * __thiscall
cmsys::SystemInformation::GetModelName_abi_cxx11_
          (string *__return_storage_ptr__,SystemInformation *this)

{
  SystemInformationImplementation *pSVar1;
  pointer pcVar2;
  
  pSVar1 = this->Implementation;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (pSVar1->ChipID).ModelName._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,
             pcVar2 + (pSVar1->ChipID).ModelName._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string SystemInformation::GetModelName()
{
  return this->Implementation->GetModelName();
}